

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3RunnerNonRecursive.hpp
# Opt level: O1

void Centaurus::Stage3Runner::
     append_value<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *values_next_it,int n,vector<unsigned_long,_std::allocator<unsigned_long>_> *values,
               vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               *tags)

{
  iterator __position;
  unsigned_long *__args;
  iterator __position_00;
  StackEntryTag local_1c;
  
  __position._M_current =
       (tags->
       super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current[-1] < VALUE) {
    local_1c = n;
    if (__position._M_current ==
        (tags->
        super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>::
      _M_realloc_insert<Centaurus::detail::StackEntryTag>(tags,__position,&local_1c);
    }
    else {
      *__position._M_current = n;
      (tags->
      super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
      )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else {
    __position._M_current[-1] = __position._M_current[-1] + n;
  }
  if (0 < n) {
    do {
      __args = values_next_it->_M_current;
      values_next_it->_M_current = __args + 1;
      __position_00._M_current =
           (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)values,__position_00,
                   __args);
      }
      else {
        *__position_00._M_current = *__args;
        (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      n = n + -1;
    } while (n != 0);
  }
  return;
}

Assistant:

static void append_value(Iterator& values_next_it, int n, std::vector<semantic_value_type>& values, std::vector<detail::StackEntryTag>& tags)
  {
    if (detail::isValueTag(tags.back())) {
      tags.back() = static_cast<detail::StackEntryTag>(static_cast<int>(tags.back()) + n);
    } else {
      tags.emplace_back(static_cast<detail::StackEntryTag>(n));
    }
#if PYCENTAURUS
    values.front() += n;
#else
    for (int i = 0; i < n; i++) {
      values.emplace_back(*values_next_it++);
    }
#endif
  }